

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O1

void __thiscall
binlog::PrettyPrinter::printEventMessage(PrettyPrinter *this,OstreamBuffer *out,Event *event)

{
  char c;
  EventSource *pEVar1;
  pointer pcVar2;
  char *pcVar3;
  char *pcVar4;
  size_t extraout_RDX;
  size_t extraout_RDX_01;
  size_t sVar5;
  ulong uVar6;
  detail *this_00;
  char *pcVar7;
  string_view tags;
  string_view tag;
  string_view full_tag;
  Range args;
  ToStringVisitor visitor;
  Range local_68;
  ToStringVisitor local_50;
  size_t extraout_RDX_00;
  
  this_00 = (detail *)(event->source->argumentTags)._M_dataplus._M_p;
  pcVar7 = (char *)(event->source->argumentTags)._M_string_length;
  local_68._begin = (event->arguments)._begin;
  local_68._end = (event->arguments)._end;
  ToStringVisitor::ToStringVisitor(&local_50,out,this);
  pEVar1 = event->source;
  if ((pEVar1->formatString)._M_string_length != 0) {
    uVar6 = 0;
    sVar5 = extraout_RDX;
    do {
      pcVar2 = (pEVar1->formatString)._M_dataplus._M_p;
      c = pcVar2[uVar6];
      if ((c == '{') && (pcVar2[uVar6 + 1] == '}')) {
        uVar6 = uVar6 + 1;
        tags._len = sVar5;
        tags._ptr = pcVar7;
        pcVar3 = (char *)mserialize::detail::tag_first_size(this_00,tags);
        pcVar4 = pcVar3;
        if (pcVar7 < pcVar3) {
          pcVar4 = pcVar7;
        }
        pcVar7 = pcVar7 + -(long)pcVar4;
        tag._len = (size_t)pcVar3;
        tag._ptr = (char *)this_00;
        full_tag._len = (size_t)pcVar3;
        full_tag._ptr = (char *)this_00;
        mserialize::detail::visit_impl<binlog::ToStringVisitor,binlog::Range>
                  (full_tag,tag,&local_50,&local_68,0x800);
        sVar5 = extraout_RDX_00;
        this_00 = (detail *)(pcVar4 + (long)this_00);
      }
      else {
        detail::OstreamBuffer::put(out,c);
        sVar5 = extraout_RDX_01;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (pEVar1->formatString)._M_string_length);
  }
  return;
}

Assistant:

void PrettyPrinter::printEventMessage(detail::OstreamBuffer& out, const Event& event) const
{
  mserialize::string_view tags = event.source->argumentTags;
  Range args = event.arguments;
  ToStringVisitor visitor(out, this);

  const std::string& fmt = event.source->formatString;
  for (std::size_t i = 0; i < fmt.size(); ++i)
  {
    const char c = fmt[i];
    if (c == '{' && fmt[i+1] == '}')
    {
      const mserialize::string_view tag = mserialize::detail::tag_pop(tags);
      mserialize::visit(tag, visitor, args);
      ++i; // skip }
    }
    else
    {
      out.put(c);
    }
  }
}